

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

BOOL __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
ProtectAllocation(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
                 Allocation *allocation,DWORD dwVirtualProtectFlags,DWORD desiredOldProtectFlag,
                 char *addressInPage)

{
  ulong uVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  size_t pageCount;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_00;
  void *segment;
  char *address;
  
  if (allocation == (Allocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x14f,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar4) goto LAB_006194d0;
    *puVar6 = 0;
  }
  if ((allocation->field_0x28 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x150,"(allocation->isAllocationUsed)","allocation->isAllocationUsed");
    if (!bVar4) goto LAB_006194d0;
    *puVar6 = 0;
  }
  if ((addressInPage != (char *)0x0) &&
     ((addressInPage < allocation->address ||
      (allocation->address + allocation->size <= addressInPage)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x151,
                       "(addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size)))"
                       ,
                       "addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size))"
                      );
    if (!bVar4) {
LAB_006194d0:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  address = allocation->address;
  uVar1 = allocation->size;
  bVar4 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,TraceProtectPagesFlag);
  if (uVar1 < 0x1001) {
    if (bVar4) {
      Output::Print(L"Protecting small allocation\n");
    }
    segment = ((allocation->field_0).page)->segment;
    address = ((allocation->field_0).page)->address;
    if (DAT_0145948a == '\x01') {
      Output::Trace(CustomHeapPhase,L"Protecting 0x%p with 0x%x\n",address,
                    (ulong)dwVirtualProtectFlags);
    }
    this_00 = this->codePageAllocators;
    pageCount = 1;
  }
  else {
    if (bVar4) {
      Output::Print(L"Protecting large allocation\n");
    }
    segment = (allocation->field_0).largeObjectAllocation.segment;
    if (addressInPage == (char *)0x0) {
      pageCount = Allocation::GetPageCount(allocation);
    }
    else {
      pcVar2 = allocation->address;
      pageCount = 1;
      if (pcVar2 + 0x1000 <= addressInPage) {
        address = pcVar2 + (((long)addressInPage - (long)pcVar2) / 0x1000) * 0x1000;
      }
    }
    if (DAT_0145948a == '\x01') {
      Output::Trace(CustomHeapPhase,L"Protecting 0x%p with 0x%x\n",address,
                    (ulong)dwVirtualProtectFlags);
    }
    this_00 = this->codePageAllocators;
  }
  BVar5 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
          ProtectPages(this_00,address,pageCount,segment,dwVirtualProtectFlags,desiredOldProtectFlag
                      );
  return BVar5;
}

Assistant:

BOOL Heap<TAlloc, TPreReservedAlloc>::ProtectAllocation(__in Allocation* allocation, DWORD dwVirtualProtectFlags, DWORD desiredOldProtectFlag, __in_opt char* addressInPage)
{
    // Allocate at the page level so that our protections don't
    // transcend allocation page boundaries. Here, allocation->address is page
    // aligned if the object is a large object allocation. If it isn't, in the else
    // branch of the following if statement, we set it to the allocation's page's
    // address. This ensures that the address being protected is always page aligned

    Assert(allocation != nullptr);
    Assert(allocation->isAllocationUsed);
    Assert(addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size)));

    char* address = allocation->address;

    size_t pageCount;
    void * segment;
    if (allocation->IsLargeAllocation())
    {
#if DBG_DUMP || defined(RECYCLER_TRACE)
        if (Js::Configuration::Global.flags.IsEnabled(Js::TraceProtectPagesFlag))
        {
            Output::Print(_u("Protecting large allocation\n"));
        }
#endif
        segment = allocation->largeObjectAllocation.segment;

        if (addressInPage != nullptr)
        {
            if (addressInPage >= allocation->address + AutoSystemInfo::PageSize)
            {
                size_t page = (addressInPage - allocation->address) / AutoSystemInfo::PageSize;

                address = allocation->address + (page * AutoSystemInfo::PageSize);
            }
            pageCount = 1;
        }
        else
        {
            pageCount = allocation->GetPageCount();
        }

        VerboseHeapTrace(_u("Protecting 0x%p with 0x%x\n"), address, dwVirtualProtectFlags);
        return this->codePageAllocators->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
    }
    else
    {
#if DBG_DUMP || defined(RECYCLER_TRACE)
        if (Js::Configuration::Global.flags.IsEnabled(Js::TraceProtectPagesFlag))
        {
            Output::Print(_u("Protecting small allocation\n"));
        }
#endif
        segment = allocation->page->segment;
        address = allocation->page->address;
        pageCount = 1;

        VerboseHeapTrace(_u("Protecting 0x%p with 0x%x\n"), address, dwVirtualProtectFlags);
        return this->codePageAllocators->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
    }
}